

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

U64 ZSTD_rollingHash_append(U64 hash,void *buf,size_t size)

{
  undefined8 local_30;
  size_t pos;
  BYTE *istart;
  size_t size_local;
  void *buf_local;
  U64 hash_local;
  
  buf_local = (void *)hash;
  for (local_30 = 0; local_30 < size; local_30 = local_30 + 1) {
    buf_local = (void *)((long)(int)(*(byte *)((long)buf + local_30) + 10) +
                        (long)buf_local * -0x30e44323485a9b9d);
  }
  return (U64)buf_local;
}

Assistant:

static U64 ZSTD_rollingHash_append(U64 hash, void const* buf, size_t size)
{
    BYTE const* istart = (BYTE const*)buf;
    size_t pos;
    for (pos = 0; pos < size; ++pos) {
        hash *= prime8bytes;
        hash += istart[pos] + ZSTD_ROLL_HASH_CHAR_OFFSET;
    }
    return hash;
}